

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Number luaL_optnumber(lua_State *L,int idx,lua_Number def)

{
  int iVar1;
  TValue local_40;
  TValue tmp;
  cTValue *o;
  lua_Number def_local;
  lua_State *plStack_20;
  int idx_local;
  lua_State *L_local;
  
  o = (cTValue *)def;
  def_local._4_4_ = idx;
  plStack_20 = L;
  tmp = (TValue)index2adr(L,idx);
  if ((uint)((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf) < 0xfffffff3) {
    L_local = *(lua_State **)tmp;
  }
  else {
    if (*(uint64_t *)tmp != 0xffffffffffffffff) {
      if (((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf == -5) &&
         (iVar1 = lj_strscan_num((GCstr *)(*(ulong *)tmp & 0x7fffffffffff),&local_40), iVar1 != 0))
      {
        return (lua_Number)local_40.u64;
      }
      lj_err_argt(plStack_20,def_local._4_4_,3);
    }
    L_local = (lua_State *)&o->gcr;
  }
  return (lua_Number)L_local;
}

Assistant:

LUALIB_API lua_Number luaL_optnumber(lua_State *L, int idx, lua_Number def)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (tvisnil(o))
    return def;
  else if (!(tvisstr(o) && lj_strscan_num(strV(o), &tmp)))
    lj_err_argt(L, idx, LUA_TNUMBER);
  return numV(&tmp);
}